

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

int duckdb::DecimalScaleUpOperator::Operation<short,int>
              (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  unkbyte10 Var2;
  int result;
  int local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<short,int>(input,&local_3c,false);
  if (bVar1) {
    return local_3c * *(int *)((long)dataptr + 0x24);
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,int>
            (&local_38,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}